

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.h
# Opt level: O0

HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
* __thiscall
TinyGC::
MakeGarbageCollected<HeapMap<LinkedNode,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
          (TinyGC *this)

{
  int iVar1;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *pHVar2;
  ostream *poVar3;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *local_40;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *local_38;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *new_obj;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lck;
  TinyGC *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->alloc_mxt_);
  CheckThreshold(this);
  pHVar2 = (HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
            *)malloc(0x48);
  *(undefined8 *)&(pHVar2->map_)._M_h._M_rehash_policy = 0;
  (pHVar2->map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (pHVar2->map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pHVar2->map_)._M_h._M_element_count = 0;
  (pHVar2->map_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (pHVar2->map_)._M_h._M_bucket_count = 0;
  (pHVar2->
  super_GarbageCollected<HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  ).super_GarbageCollectedBase._vptr_GarbageCollectedBase = (_func_int **)0x0;
  (pHVar2->
  super_GarbageCollected<HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  ).super_GarbageCollectedBase.mark_ = false;
  *(undefined3 *)
   &(pHVar2->
    super_GarbageCollected<HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
    ).super_GarbageCollectedBase.field_0x9 = 0;
  (pHVar2->
  super_GarbageCollected<HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  ).super_GarbageCollectedBase.obj_size_ = 0;
  (pHVar2->map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  ::HeapMap(pHVar2);
  local_38 = pHVar2;
  poVar3 = std::operator<<((ostream *)&std::cerr,"Object is allocated at ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_40 = local_38;
  std::
  unordered_set<GarbageCollectedBase_*,_std::hash<GarbageCollectedBase_*>,_std::equal_to<GarbageCollectedBase_*>,_std::allocator<GarbageCollectedBase_*>_>
  ::insert(&this->objs_addr_,(value_type *)&local_40);
  iVar1 = GarbageCollectedBase::GetObjSize((GarbageCollectedBase *)local_38);
  pHVar2 = local_38;
  this->bytes_allocated_ = iVar1 + this->bytes_allocated_;
  this->size_of_objects_ = this->size_of_objects_ + 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return pHVar2;
}

Assistant:

T *TinyGC::MakeGarbageCollected(Args &&...args) {
  std::unique_lock<std::mutex> lck(alloc_mxt_);
  CheckThreshold();
  T *new_obj = ::new (malloc(sizeof(T))) T(std::forward<Args>(args)...);
  LOG("Object is allocated at " << new_obj);
  objs_addr_.insert(new_obj);
  this->bytes_allocated_ += new_obj->GetObjSize();
  this->size_of_objects_++;
  return new_obj;
}